

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall MeterPrivate::drawScale(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  bool bVar1;
  int iVar2;
  int i;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  QVector<qreal> alreadyDrawn;
  QArrayDataPointer<double> local_78;
  QMarginsF local_50;
  
  QPainter::save();
  QPainter::setPen((QColor *)painter);
  local_50.m_top._0_4_ = *(undefined4 *)&params->margin;
  local_50.m_top._4_4_ = *(undefined4 *)((long)&params->margin + 4);
  local_50.m_left = params->margin;
  local_50.m_right._0_4_ = local_50.m_top._0_4_;
  local_50.m_right._4_4_ = local_50.m_top._4_4_;
  local_50.m_bottom._0_4_ = local_50.m_top._0_4_;
  local_50.m_bottom._4_4_ = local_50.m_top._4_4_;
  operator-(&params->rect,&local_50);
  QPainter::drawArc((QRectF *)painter,(int)&local_78,(int)((-90.0 - params->startScaleAngle) * 16.0)
                   );
  QPainter::translate(painter,(double)this->radius,(double)this->radius);
  QPainter::rotate(params->startScaleAngle);
  local_78.d = (Data *)0x0;
  local_78.ptr = (double *)0x0;
  local_78.size = 0;
  QList<double>::append((QList<double> *)&local_78,params->startScaleAngle);
  dVar7 = this->scaleGridStep;
  if (dVar7 <= 0.0) {
    QPainter::drawLine(painter,0,(int)((double)this->radius - params->margin),0,
                       (int)(((double)this->radius - params->gridLabelSize) - params->margin));
    QPainter::rotate(params->scaleDegree);
    QList<double>::append((QList<double> *)&local_78,params->scaleDegree);
    QPainter::drawLine(painter,0,(int)((double)this->radius - params->margin),0,
                       (int)(((double)this->radius - params->gridLabelSize) - params->margin));
  }
  else {
    dVar5 = this->maxValue - this->minValue;
    dVar6 = dVar5 / dVar7;
    iVar2 = (int)dVar6;
    dVar7 = (params->scaleDegree / dVar5) * dVar7;
    for (iVar3 = 0; iVar3 <= iVar2; iVar3 = iVar3 + 1) {
      QPainter::drawLine(painter,0,(int)((double)this->radius - params->margin),0,
                         (int)(((double)this->radius - params->gridLabelSize) - params->margin));
      QPainter::rotate(dVar7);
      QList<double>::append
                ((QList<double> *)&local_78,(double)iVar3 * dVar7 + params->startScaleAngle);
    }
    dVar6 = dVar6 - (double)iVar2;
    uVar4 = -(ulong)(dVar6 < -dVar6);
    if (1e-06 < (double)(~uVar4 & (ulong)dVar6 | (ulong)-dVar6 & uVar4)) {
      QPainter::restore();
      QPainter::save();
      QPainter::translate(painter,(double)this->radius,(double)this->radius);
      QPainter::rotate(params->startScaleAngle + params->scaleDegree);
      QPainter::setPen((QColor *)painter);
      QPainter::drawLine(painter,0,(int)((double)this->radius - params->margin),0,
                         (int)(((double)this->radius - params->gridLabelSize) - params->margin));
      QList<double>::append
                ((QList<double> *)&local_78,params->startScaleAngle + params->scaleDegree);
    }
  }
  QPainter::restore();
  if (0.0 < this->scaleStep) {
    QPainter::save();
    QPainter::setPen((QColor *)painter);
    QPainter::translate(painter,(double)this->radius,(double)this->radius);
    QPainter::rotate(params->startScaleAngle);
    dVar7 = (this->maxValue - this->minValue) / this->scaleStep;
    dVar5 = params->scaleDegree / (double)(int)dVar7;
    QPainter::rotate(dVar5);
    for (iVar2 = 0; iVar2 <= (int)dVar7 + -2; iVar2 = iVar2 + 1) {
      local_50.m_left = (double)iVar2 * dVar5 + params->startScaleAngle + dVar5;
      bVar1 = QListSpecialMethodsBase<double>::contains<double>
                        ((QListSpecialMethodsBase<double> *)&local_78,&local_50.m_left);
      if (!bVar1) {
        QPainter::drawLine(painter,0,(int)((double)this->radius - params->margin),0,
                           (int)(((double)this->radius - params->scaleWidth) - params->margin));
      }
      QPainter::rotate(dVar5);
    }
    QPainter::restore();
  }
  QArrayDataPointer<double>::~QArrayDataPointer(&local_78);
  return;
}

Assistant:

void
MeterPrivate::drawScale( QPainter & painter, DrawParams & params )
{
	painter.save();
	painter.setPen( textColor );
	painter.drawArc( params.rect -
	QMarginsF( params.margin, params.margin, params.margin, params.margin ),
		( -90.0 - params.startScaleAngle ) * 16, -params.scaleDegree * 16 );
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle );

	QVector< qreal > alreadyDrawn;
	alreadyDrawn.append( params.startScaleAngle );

	if( scaleGridStep > 0.0 )
	{
		const int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal scaleStepInDegree = params.scaleDegree / ( maxValue - minValue ) * scaleGridStep;

		for( int i = 0; i <= stepsCount; ++i )
		{
			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );
			painter.rotate( scaleStepInDegree );
			alreadyDrawn.append( params.startScaleAngle + i * scaleStepInDegree );
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			painter.restore();

			painter.save();

			painter.translate( radius, radius );
			painter.rotate( params.startScaleAngle + params.scaleDegree );
			painter.setPen( textColor );

			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );

			alreadyDrawn.append( params.startScaleAngle + params.scaleDegree );
		}
	}
	else
	{
		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );

		painter.rotate( params.scaleDegree );

		alreadyDrawn.append( params.scaleDegree );

		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );
	}

	painter.restore();

	if( scaleStep > 0.0 )
	{
		painter.save();
		painter.setPen( textColor );
		painter.translate( radius, radius );
		painter.rotate( params.startScaleAngle );

		int stepsCount = ( ( maxValue - minValue ) / scaleStep );
		const qreal scaleStepInDegree = params.scaleDegree / stepsCount;

		stepsCount -= 2;

		painter.rotate( scaleStepInDegree );

		for( int i = 0; i <= stepsCount; ++i )
		{
			if( !alreadyDrawn.contains( ( params.startScaleAngle + scaleStepInDegree )
				+ i * scaleStepInDegree ) )
					painter.drawLine( 0, radius - params.margin, 0,
						radius - params.scaleWidth - params.margin );

			painter.rotate( scaleStepInDegree );
		}

		painter.restore();
	}
}